

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O1

DFsSection * __thiscall DFsScript::FindSectionEnd(DFsScript *this,char *brace)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar2;
  long lVar3;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 in_RDX;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar4;
  char *pcVar5;
  bool bVar6;
  
  lVar3 = 0;
  do {
    aVar4 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)this->sections[lVar3].field_0.p;
    if ((aVar4.p != (DFsSection *)0x0) && ((((aVar4.p)->super_DObject).ObjectFlags & 0x20) != 0)) {
      this->sections[lVar3].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)0x0;
      aVar4.p = (DFsSection *)0x0;
    }
    bVar6 = aVar4.p == (DFsSection *)0x0;
    aVar2 = in_RDX;
    if (!bVar6) {
      pcVar5 = this->data + (aVar4.p)->end_index;
      while (aVar2 = aVar4, pcVar5 != brace) {
        aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)((aVar4.p)->next).field_0.p;
        if ((aVar1.p != (DFsSection *)0x0) && ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) != 0)
           ) {
          ((aVar4.p)->next).field_0.p = (DFsSection *)0x0;
          aVar1.p = (DFsSection *)0x0;
        }
        bVar6 = aVar1.p == (DFsSection *)0x0;
        aVar2 = in_RDX;
        if (bVar6) break;
        aVar4 = aVar1;
        pcVar5 = this->data + (aVar1.p)->end_index;
      }
    }
    if (!bVar6) {
      return aVar2.p;
    }
    lVar3 = lVar3 + 1;
    in_RDX = aVar2;
    if (lVar3 == 0x11) {
      return (DFsSection *)0x0;
    }
  } while( true );
}

Assistant:

DFsSection *DFsScript::FindSectionEnd(const char *brace)
{
	int n;
	
	// hash table is no use, they are hashed according to
	// the offset of the starting brace
	
	// we have to go through every entry to find from the
	// ending brace
	
	for(n=0; n<SECTIONSLOTS; n++)      // check all sections in all chains
	{
		DFsSection *current = sections[n];
		
		while(current)
		{
			if(SectionEnd(current) == brace) return current;        // found it
			current = current->next;
		}
	}
	return NULL;    // not found
}